

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

int __thiscall
libtorrent::aux::piece_picker::add_blocks
          (piece_picker *this,piece_index_t piece,
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          *pieces,vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                  *interesting_blocks,
          vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> *backup_blocks,
          int num_blocks,int prefer_contiguous_blocks,torrent_peer *peer,
          vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          *ignore,picker_options_t options)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> rhs;
  int iVar4;
  value_type *this_00;
  reference dp;
  int *piVar5;
  int local_bc;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_b8;
  int local_b4;
  int local_b0;
  int j_1;
  int local_a8;
  value_type local_a4;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_a0;
  piece_index_t k;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> local_94
  ;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> __end3;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> __begin3
  ;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *__range3;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  local_7c;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> range;
  int j;
  int local_68;
  int payload_blocks;
  __normal_iterator<const_libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
  local_58;
  const_iterator i;
  strong_typedef<unsigned_char,_libtorrent::aux::dl_queue_tag,_void> local_41;
  int local_40;
  int iStack_3c;
  download_queue_t state;
  int num_blocks_local;
  vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> *backup_blocks_local;
  vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
  *interesting_blocks_local;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *pieces_local;
  piece_picker *this_local;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_10;
  int iStack_c;
  picker_options_t options_local;
  piece_index_t piece_local;
  
  local_40 = piece.m_val;
  iStack_3c = num_blocks;
  local_10.m_val = piece.m_val;
  bVar1 = ::(anonymous_namespace)::
          contains<std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>
                    (ignore,(strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)piece.m_val
                    );
  if (bVar1) {
    iStack_c = iStack_3c;
  }
  else {
    this_00 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
              ::operator[](&this->m_piece_map,local_10);
    local_41.m_val = (uchar)piece_pos::download_queue(this_00);
    bVar1 = strong_typedef<unsigned_char,_libtorrent::aux::dl_queue_tag,_void>::operator!=
                      (&local_41,&piece_pos::piece_open);
    if ((bVar1) &&
       (bVar1 = strong_typedef<unsigned_char,_libtorrent::aux::dl_queue_tag,_void>::operator!=
                          (&local_41,&piece_pos::piece_downloading), bVar1)) {
      iStack_c = iStack_3c;
    }
    else {
      bVar1 = strong_typedef<unsigned_char,_libtorrent::aux::dl_queue_tag,_void>::operator==
                        (&local_41,&piece_pos::piece_downloading);
      if (bVar1) {
        i._M_current._4_2_ = options.m_val;
        i._M_current._2_2_ = 8;
        i._M_current._6_2_ =
             libtorrent::flags::operator&
                       (options.m_val,
                        (bitfield_flag<unsigned_short,_libtorrent::aux::picker_options_tag,_void>)
                        0x8);
        bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                          ((bitfield_flag *)((long)&i._M_current + 6));
        if (bVar1) {
          iStack_c = iStack_3c;
        }
        else {
          local_58._M_current =
               (downloading_piece *)
               find_dl_piece(this,(download_queue_t)0x0,(piece_index_t)local_10.m_val);
          dp = __gnu_cxx::
               __normal_iterator<const_libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
               ::operator*(&local_58);
          iStack_c = add_blocks_downloading
                               (this,dp,pieces,interesting_blocks,backup_blocks,iStack_3c,
                                prefer_contiguous_blocks,peer,options);
        }
      }
      else {
        local_68 = blocks_in_piece(this,local_10.m_val);
        range._end.m_val = local_10.m_val;
        iVar2 = pad_bytes_in_piece(this,local_10.m_val);
        iVar3 = block_size(this);
        local_68 = local_68 - iVar2 / iVar3;
        if (prefer_contiguous_blocks == 0) {
          if (iStack_3c < local_68) {
            local_68 = iStack_3c;
          }
          for (range._begin.m_val = 0; range._begin.m_val < local_68;
              range._begin.m_val = range._begin.m_val + 1) {
            ::std::vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>::
            emplace_back<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>&,int&>
                      ((vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>> *)
                       interesting_blocks,&local_10,(int *)&range);
          }
          iStack_3c = iStack_3c - local_68;
        }
        else {
          local_7c = expand_piece(this,(piece_index_t)local_10.m_val,prefer_contiguous_blocks,pieces
                                  ,options);
          ___end3 = &local_7c;
          local_94 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                     ::begin(___end3);
          rhs = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                ::end(___end3);
          while( true ) {
            k.m_val = (int)local_94.m_idx.m_val;
            local_a0 = rhs.m_idx.m_val;
            bVar1 = libtorrent::operator!=(local_94,rhs);
            if (!bVar1) break;
            local_a8 = (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                            ::operator*(&local_94);
            local_a4.m_val = local_a8;
            bVar1 = ::(anonymous_namespace)::
                    contains<std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>
                              (ignore,(strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)
                                      local_a8);
            if (bVar1) {
              prefer_contiguous_blocks = prefer_contiguous_blocks + -1;
              if ((prefer_contiguous_blocks == 0) && (iStack_3c < 1)) break;
            }
            else {
              ::std::
              vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
              ::push_back(ignore,&local_a4);
              j_1 = local_a4.m_val;
              iVar2 = blocks_in_piece(this,local_a4.m_val);
              local_b0 = local_a4.m_val;
              iVar3 = pad_bytes_in_piece(this,local_a4.m_val);
              iVar4 = block_size(this);
              for (local_b4 = 0; local_b4 < iVar2 - iVar3 / iVar4; local_b4 = local_b4 + 1) {
                ::std::vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>::
                emplace_back<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,int&>
                          ((vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>
                            *)interesting_blocks,&local_a4,&local_b4);
                iStack_3c = iStack_3c + -1;
                prefer_contiguous_blocks = prefer_contiguous_blocks + -1;
                if ((prefer_contiguous_blocks == 0) && (iStack_3c < 1)) break;
              }
            }
            local_b8.m_val =
                 (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                      ::operator++(&local_94);
          }
        }
        local_bc = 0;
        piVar5 = ::std::max<int>(&stack0xffffffffffffffc4,&local_bc);
        iStack_c = *piVar5;
      }
    }
  }
  return iStack_c;
}

Assistant:

int piece_picker::add_blocks(piece_index_t piece
		, typed_bitfield<piece_index_t> const& pieces
		, std::vector<piece_block>& interesting_blocks
		, std::vector<piece_block>& backup_blocks
		, int num_blocks, int prefer_contiguous_blocks
		, aux::torrent_peer* peer, std::vector<piece_index_t>& ignore
		, picker_options_t const options) const
	{
		TORRENT_ASSERT(is_piece_free(piece, pieces));

		// ignore pieces found in the ignore list
		if (contains(ignore, piece)) return num_blocks;

		auto const state = m_piece_map[piece].download_queue();
		if (state != piece_pos::piece_open
			&& state != piece_pos::piece_downloading)
			return num_blocks;

		TORRENT_ASSERT(m_piece_map[piece].priority(this) >= 0);
		if (state == piece_pos::piece_downloading)
		{
			// if we're prioritizing partials, we've already
			// looked through the downloading pieces
			if (options & prioritize_partials) return num_blocks;

			auto i = find_dl_piece(piece_pos::piece_downloading, piece);
			TORRENT_ASSERT(i != m_downloads[state].end());

			return add_blocks_downloading(*i, pieces
				, interesting_blocks, backup_blocks
				, num_blocks, prefer_contiguous_blocks, peer, options);
		}

		// pick a new piece
		int payload_blocks = blocks_in_piece(piece) - pad_bytes_in_piece(piece) / block_size();

		if (prefer_contiguous_blocks == 0)
		{
			if (payload_blocks > num_blocks)
				payload_blocks = num_blocks;
			TORRENT_ASSERT(is_piece_free(piece, pieces));
			for (int j = 0; j < payload_blocks; ++j)
			{
				TORRENT_ASSERT(j < blocks_in_piece(piece));
				interesting_blocks.emplace_back(piece, j);
			}
			num_blocks -= payload_blocks;
		}
		else
		{
			auto const range = expand_piece(piece, prefer_contiguous_blocks
				, pieces, options);
			for (piece_index_t const k : range)
			{
				if (contains(ignore, k))
				{
					--prefer_contiguous_blocks;
					if (prefer_contiguous_blocks == 0
						&& num_blocks <= 0) break;
					continue;
				}
				ignore.push_back(k);

				TORRENT_ASSERT(m_piece_map[k].priority(this) > 0);
				payload_blocks = blocks_in_piece(k) - pad_bytes_in_piece(k) / block_size();
				TORRENT_ASSERT(is_piece_free(k, pieces));
				for (int j = 0; j < payload_blocks; ++j)
				{
					TORRENT_ASSERT(j < blocks_in_piece(k));
					interesting_blocks.emplace_back(k, j);
					--num_blocks;
					--prefer_contiguous_blocks;
					if (prefer_contiguous_blocks == 0
						&& num_blocks <= 0) break;
				}
			}
		}
#if TORRENT_USE_INVARIANT_CHECKS
		verify_pick(interesting_blocks, pieces);
#endif
		return std::max(num_blocks, 0);
	}